

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O0

HermiteSpline<5U,_2U> *
HermiteSpline<5U,_2U>::fit(array<Eigen::Matrix<double,_2,__1,_0,_2,__1>,_3UL> *values)

{
  Polynomial sp;
  Index IVar1;
  undefined8 in_RSI;
  HermiteSpline<5U,_2U> *in_RDI;
  int j;
  int k;
  Matrix<double,_2,_3,_1,_2,_3> B;
  Matrix<double,_2,_3,_1,_2,_3> A;
  int N;
  HermiteSpline<5U,_2U> *result;
  EigenBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *in_stack_fffffffffffffdc8;
  HermiteSpline<5U,_2U> *in_stack_fffffffffffffdd0;
  Index in_stack_fffffffffffffdd8;
  DenseBase<Eigen::Matrix<double,_2,__1,_0,_2,__1>_> *in_stack_fffffffffffffde0;
  HermiteSpline<5U,_2U> *pHVar2;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  Matrix<double,_2,_3,_0,_2,_3> *in_stack_ffffffffffffff08;
  Matrix<double,_2,_3,_0,_2,_3> *in_stack_ffffffffffffff10;
  undefined4 local_90;
  undefined4 local_8c;
  
  pHVar2 = in_RDI;
  std::array<Eigen::Matrix<double,_2,_-1,_0,_2,_-1>,_3UL>::operator[]
            ((array<Eigen::Matrix<double,_2,__1,_0,_2,__1>,_3UL> *)in_stack_fffffffffffffdd0,
             (size_type)in_stack_fffffffffffffdc8);
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_-1,_0,_2,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,_2,__1,_0,_2,__1>_> *)0x117992);
  HermiteSpline(in_stack_fffffffffffffdd0);
  Eigen::Matrix<double,_2,_3,_1,_2,_3>::Matrix((Matrix<double,_2,_3,_1,_2,_3> *)0x1179ba);
  Eigen::Matrix<double,_2,_3,_1,_2,_3>::Matrix((Matrix<double,_2,_3,_1,_2,_3> *)0x1179c9);
  for (local_8c = -1; local_8c < (int)IVar1 + -1; local_8c = local_8c + 1) {
    for (local_90 = 0; local_90 < 3; local_90 = local_90 + 1) {
      std::array<Eigen::Matrix<double,_2,_-1,_0,_2,_-1>,_3UL>::operator[]
                ((array<Eigen::Matrix<double,_2,__1,_0,_2,__1>,_3UL> *)in_stack_fffffffffffffdd0,
                 (size_type)in_stack_fffffffffffffdc8);
      Eigen::DenseBase<Eigen::Matrix<double,_2,_-1,_0,_2,_-1>_>::col
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::col
                ((DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)in_stack_fffffffffffffde0,
                 in_stack_fffffffffffffdd8);
      Eigen::Block<Eigen::Matrix<double,2,3,1,2,3>,2,1,false>::operator=
                ((Block<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_2,_1,_false> *)
                 in_stack_fffffffffffffdd0,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_2,__1,_0,_2,__1>,_2,_1,_true>_> *)
                 in_stack_fffffffffffffdc8);
    }
    if (-1 < local_8c) {
      Eigen::Matrix<double,2,3,0,2,3>::Matrix<Eigen::Matrix<double,2,3,1,2,3>>
                ((Matrix<double,_2,_3,_0,_2,_3> *)in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdc8);
      Eigen::Matrix<double,2,3,0,2,3>::Matrix<Eigen::Matrix<double,2,3,1,2,3>>
                ((Matrix<double,_2,_3,_0,_2,_3> *)in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdc8);
      UnitBoundedPolynomial<5U,_2U>::fit(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      sp._dims[0].coeffs[1] = (double)local_138;
      sp._dims[0].coeffs[0] = (double)uStack_140;
      sp._dims[0].coeffs[2] = (double)uStack_130;
      sp._dims[0].coeffs[3] = (double)local_128;
      sp._dims[0].coeffs[4] = (double)uStack_120;
      sp._dims[0].coeffs[5] = (double)local_118;
      sp._dims[1].coeffs[0] = (double)uStack_110;
      sp._dims[1].coeffs[1] = (double)local_108;
      sp._dims[1].coeffs[2] = (double)uStack_100;
      sp._dims[1].coeffs[3] = (double)in_stack_ffffffffffffff08;
      sp._dims[1].coeffs[4] = (double)in_RSI;
      sp._dims[1].coeffs[5] = (double)in_RDI;
      sp.length = (double)pHVar2;
      in_stack_fffffffffffffdc8 = local_158;
      in_stack_fffffffffffffdd0 = uStack_150;
      in_stack_fffffffffffffdd8 = local_148;
      in_stack_fffffffffffffde0 = uStack_140;
      add(uStack_150,sp);
    }
    Eigen::Matrix<double,_2,_3,_1,_2,_3>::operator=
              ((Matrix<double,_2,_3,_1,_2,_3> *)in_stack_fffffffffffffdd0,
               (Matrix<double,_2,_3,_1,_2,_3> *)in_stack_fffffffffffffdc8);
  }
  return in_RDI;
}

Assistant:

HermiteSpline<Order, Dims> HermiteSpline<Order, Dims>::fit(array<MatrixNXd, Polynomial1::RequiredValues> values)
{
    const int N = values[0].cols()-1; // number of splines
    HermiteSpline<Order, Dims> result;

    Matrix<double, Dims, Polynomial1::RequiredValues, RowMajor> A;
    Matrix<double, Dims, Polynomial1::RequiredValues, RowMajor> B;

    for (int k = -1; k < N; ++k)
    {
        for (int j = 0; j < Polynomial1::RequiredValues; ++j)
        {
            B.col(j) = values[j].col(k+1);
        }

        if (k >= 0)
        {
            result.add(UnitBoundedPolynomial<Order, Dims>::fit(A, B));
        }

        A = B;
    }

    return result;
}